

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O1

void dipfountain(obj *obj)

{
  undefined1 *puVar1;
  level *plVar2;
  boolean bVar3;
  xchar xVar4;
  xchar xVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  obj *poVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  
  if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
     ((youmonst.data)->mlet == '\x05')) {
    pline("You are floating high above the %s.","fountain");
    return;
  }
  if ((((obj->otyp == 0x26) && (obj->quan == 1)) && (4 < u.ulevel)) &&
     ((uVar6 = mt_random(),
      (uVar6 * -0x55555555 >> 1 | (uint)((uVar6 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab &&
      (obj->oartifact == '\0')))) {
    pcVar7 = artiname(1);
    bVar3 = exist_artifact(0x26,pcVar7);
    if (bVar3 == '\0') {
      if (u.ualign.type == '\x01') {
        pline("From the murky depths, a hand reaches up to bless the sword.");
        pline("As the hand retreats, the fountain disappears!");
        pcVar7 = artiname(1);
        poVar10 = oname(obj,pcVar7);
        discover_artifact('\x01');
        bless(poVar10);
        *(uint *)&poVar10->field_0x4a = *(uint *)&poVar10->field_0x4a & 0xffffe0ff | 0x1000;
        bVar3 = '\x01';
      }
      else {
        pline("A freezing mist rises from the water and envelopes the sword.");
        pline("The fountain disappears!");
        curse(obj);
        if ((-6 < obj->spe) && (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) {
          obj->spe = obj->spe + -1;
        }
        obj->field_0x4b = obj->field_0x4b & 0xef;
        bVar3 = '\0';
      }
      exercise(2,bVar3);
      update_inventory();
      plVar2 = level;
      xVar4 = u.ux;
      lVar12 = (long)u.uy;
      level->locations[u.ux][lVar12].typ = '\x19';
      puVar1 = &plVar2->locations[xVar4][lVar12].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      newsym((int)u.ux,(int)u.uy);
      (level->flags).nfountains = (level->flags).nfountains + 0xff;
      bVar3 = in_town((int)u.ux,(int)u.uy);
      if (bVar3 == '\0') {
        return;
      }
      angry_guards('\0');
      return;
    }
  }
  bVar3 = get_wet(obj);
  if ((bVar3 != '\0') && (uVar6 = mt_random(), (uVar6 & 1) == 0)) {
    return;
  }
  if (obj->otyp == 0x141) {
    useup(obj);
    return;
  }
  uVar6 = mt_random();
  switch(uVar6 + uVar6 / 0x1e + uVar6 / 0x1e + (uVar6 / 0x1e) * -0x20) {
  case 0xf:
    curse(obj);
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    if ((obj->field_0x4a & 1) != 0) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("The water glows for a moment.");
      }
      uncurse(obj);
      break;
    }
    pcVar7 = "A feeling of loss comes over you.";
    goto LAB_001a01fc;
  case 0x14:
    dowaterdemon();
    break;
  case 0x15:
    dowaternymph();
    break;
  case 0x16:
    dowatersnakes();
    break;
  case 0x17:
    if ((level->locations[u.ux][u.uy].field_0x6 & 0x10) == 0) {
      dofindgem();
      break;
    }
  case 0x18:
    dogushforth(0);
    break;
  case 0x19:
    pcVar7 = body_part(0);
    pline("A strange tingling runs up your %s.",pcVar7);
    break;
  case 0x1a:
    pcVar7 = "You feel a sudden chill.";
LAB_001a01fc:
    pline(pcVar7);
    break;
  case 0x1b:
    pline("An urge to take a bath overwhelms you.");
    lVar12 = money_cnt(invent);
    if (10 < lVar12) {
      uVar8 = somegold(lVar12);
      if (9 < (long)uVar8 && invent != (obj *)0x0) {
        uVar8 = uVar8 / 10;
        poVar10 = invent;
        do {
          if (poVar10->oclass == '\f') {
            lVar11 = (long)objects[poVar10->otyp].oc_cost;
            lVar9 = (long)(uVar8 + lVar11 + -1) / lVar11;
            iVar13 = poVar10->quan;
            lVar12 = (long)iVar13;
            if (lVar9 < iVar13) {
              lVar12 = lVar9;
            }
            uVar8 = uVar8 - lVar12 * lVar11;
            iVar13 = iVar13 - (int)lVar12;
            poVar10->quan = iVar13;
            if (iVar13 == 0) {
              delobj(poVar10);
            }
          }
          poVar10 = poVar10->nobj;
        } while ((poVar10 != (obj *)0x0) && (0 < (long)uVar8));
      }
      pline("You lost some of your money in the fountain!");
      puVar1 = &level->locations[u.ux][u.uy].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffef;
      exercise(2,'\0');
    }
    break;
  case 0x1c:
    uVar6 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
    if ((uVar6 & 0x10) == 0) {
      *(uint *)&level->locations[u.ux][u.uy].field_0x6 = uVar6 | 0x10;
      xVar4 = dunlevs_in_dungeon(&u.uz);
      xVar5 = dunlev(&u.uz);
      uVar6 = mt_random();
      mkgold((ulong)(SUB164(ZEXT416(uVar6) % SEXT816((long)(((int)xVar4 - (int)xVar5) * 2 + 2)),0) +
                    6),level,(int)u.ux,(int)u.uy);
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Far below you, you see coins glistening in the water.");
      }
      exercise(2,'\x01');
      newsym((int)u.ux,(int)u.uy);
    }
  }
  update_inventory();
  dryup(u.ux,u.uy,'\x01');
  return;
}

Assistant:

void dipfountain(struct obj *obj)
{
	if (Levitation) {
		floating_above("fountain");
		return;
	}

	/* Don't grant Excalibur when there's more than one object.  */
	/* (quantity could be > 1 if merged daggers got polymorphed) */
	if (obj->otyp == LONG_SWORD && obj->quan == 1L
	    && u.ulevel >= 5 && !rn2(6)
	    && !obj->oartifact
	    && !exist_artifact(LONG_SWORD, artiname(ART_EXCALIBUR))) {

		if (u.ualign.type != A_LAWFUL) {
			/* Ha!  Trying to cheat her. */
			pline("A freezing mist rises from the water and envelopes the sword.");
			pline("The fountain disappears!");
			curse(obj);
			if (obj->spe > -6 && !rn2(3)) obj->spe--;
			obj->oerodeproof = FALSE;
			exercise(A_WIS, FALSE);
		} else {
			/* The lady of the lake acts! - Eric Backus */
			/* Be *REAL* nice */
	  pline("From the murky depths, a hand reaches up to bless the sword.");
			pline("As the hand retreats, the fountain disappears!");
			obj = oname(obj, artiname(ART_EXCALIBUR));
			discover_artifact(ART_EXCALIBUR);
			bless(obj);
			obj->oeroded = obj->oeroded2 = 0;
			obj->oerodeproof = TRUE;
			exercise(A_WIS, TRUE);
		}
		update_inventory();
		level->locations[u.ux][u.uy].typ = ROOM;
		level->locations[u.ux][u.uy].looted = 0;
		newsym(u.ux, u.uy);
		level->flags.nfountains--;
		if (in_town(u.ux, u.uy))
		    angry_guards(FALSE);
		return;
	} else if (get_wet(obj) && !rn2(2))
		return;

	/* Acid and water don't mix */
	if (obj->otyp == POT_ACID) {
	    useup(obj);
	    return;
	}

	switch (rnd(30)) {
		case 16: /* Curse the item */
			curse(obj);
			break;
		case 17:
		case 18:
		case 19:
		case 20: /* Uncurse the item */
			if (obj->cursed) {
			    if (!Blind)
				pline("The water glows for a moment.");
			    uncurse(obj);
			} else {
			    pline("A feeling of loss comes over you.");
			}
			break;
		case 21: /* Water Demon */
			dowaterdemon();
			break;
		case 22: /* Water Nymph */
			dowaternymph();
			break;
		case 23: /* an Endless Stream of Snakes */
			dowatersnakes();
			break;
		case 24: /* Find a gem */
			if (!FOUNTAIN_IS_LOOTED(u.ux,u.uy)) {
				dofindgem();
				break;
			}
		case 25: /* Water gushes forth */
			dogushforth(FALSE);
			break;
		case 26: /* Strange feeling */
			pline("A strange tingling runs up your %s.",
							body_part(ARM));
			break;
		case 27: /* Strange feeling */
			pline("You feel a sudden chill.");
			break;
		case 28: /* Strange feeling */
			pline("An urge to take a bath overwhelms you.");
			{
			    long money = money_cnt(invent);
			    struct obj *otmp;
                            if (money > 10) {
				/* Amount to loose.  Might get rounded up as fountains don't pay change... */
			        money = somegold(money) / 10; 
			        for (otmp = invent; otmp && money > 0; otmp = otmp->nobj) if (otmp->oclass == COIN_CLASS) {
				    int denomination = objects[otmp->otyp].oc_cost;
				    long coin_loss = (money + denomination - 1) / denomination;
                                    coin_loss = min(coin_loss, otmp->quan);
				    otmp->quan -= coin_loss;
				    money -= coin_loss * denomination;				  
				    if (!otmp->quan) delobj(otmp);
				}
			        pline("You lost some of your money in the fountain!");
				CLEAR_FOUNTAIN_LOOTED(u.ux,u.uy);
			        exercise(A_WIS, FALSE);
                            }
			}
			break;
		case 29: /* You see coins */

		/* We make fountains have more coins the closer you are to the
		 * surface.  After all, there will have been more people going
		 * by.	Just like a shopping mall!  Chris Woodbury  */

		    if (FOUNTAIN_IS_LOOTED(u.ux,u.uy)) break;
		    SET_FOUNTAIN_LOOTED(u.ux,u.uy);
		    mkgold((long)
			(rnd((dunlevs_in_dungeon(&u.uz)-dunlev(&u.uz)+1)*2)+5),
			level, u.ux, u.uy);
		    if (!Blind)
		pline("Far below you, you see coins glistening in the water.");
		    exercise(A_WIS, TRUE);
		    newsym(u.ux,u.uy);
		    break;
	}
	update_inventory();
	dryup(u.ux, u.uy, TRUE);
}